

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::GridDataType1::Encode(GridDataType1 *this,KDataStream *stream)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  
  GridData::Encode(&this->super_GridData,stream);
  KDataStream::Write<float>(stream,*(float *)&(this->super_GridData).field_0xc);
  KDataStream::Write<float>(stream,(float)this->m_f32FieldOffset);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumValues);
  puVar1 = (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_vui16Values).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    KDataStream::Write<unsigned_short>(stream,*puVar2);
  }
  if ((this->m_ui16NumValues & 1) == 0) {
    return;
  }
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  return;
}

Assistant:

void GridDataType1::Encode( KDataStream & stream ) const
{
    GridData::Encode( stream );

    stream << m_f32FieldScale
           << m_f32FieldOffset
           << m_ui16NumValues;

    vector<KUINT16>::const_iterator citr = m_vui16Values.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vui16Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    // Should we add some padding onto the end? We need to have a 32 bit alignment.
    if( m_ui16NumValues % 2 == 1 )
    {
        stream << m_ui16Padding;
    }
}